

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::VertexVaryingShader::shadeFragments
          (VertexVaryingShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  int iVar1;
  int iVar2;
  FragmentShadingContext *pFVar3;
  rr local_98 [16];
  Vector<float,_4> local_88;
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  int local_58;
  int fragNdx_2;
  int local_44;
  int fragNdx_1;
  int local_30;
  int local_2c;
  int fragNdx;
  int packetNdx;
  FragmentShadingContext *context_local;
  FragmentPacket *pFStack_18;
  int numPackets_local;
  FragmentPacket *packets_local;
  VertexVaryingShader *this_local;
  
  _fragNdx = context;
  context_local._4_4_ = numPackets;
  pFStack_18 = packets;
  packets_local = (FragmentPacket *)this;
  for (local_2c = 0; local_2c < context_local._4_4_; local_2c = local_2c + 1) {
    iVar1 = this->m_geometryOut;
    if (iVar1 == 0) {
      for (local_30 = 0; pFVar3 = _fragNdx, iVar2 = local_2c, iVar1 = local_30, local_30 < 4;
          local_30 = local_30 + 1) {
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&stack0xffffffffffffffc0,1.0,0.0,0.0,1.0);
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (pFVar3,iVar2,iVar1,0,(Vector<float,_4> *)&stack0xffffffffffffffc0);
      }
    }
    else if (iVar1 == 1) {
      for (local_44 = 0; pFVar3 = _fragNdx, iVar2 = local_2c, iVar1 = local_44, local_44 < 4;
          local_44 = local_44 + 1) {
        rr::readTriangleVarying<float>
                  ((rr *)&stack0xffffffffffffffac,pFStack_18 + local_2c,_fragNdx,0,local_44);
        rr::writeFragmentOutput<tcu::Vector<float,4>>
                  (pFVar3,iVar2,iVar1,0,(Vector<float,_4> *)&stack0xffffffffffffffac);
      }
    }
    else if (iVar1 == 2) {
      for (local_58 = 0; pFVar3 = _fragNdx, iVar2 = local_2c, iVar1 = local_58, local_58 < 4;
          local_58 = local_58 + 1) {
        rr::readTriangleVarying<float>((rr *)&local_78,pFStack_18 + local_2c,_fragNdx,0,local_58);
        rr::readTriangleVarying<float>(local_98,pFStack_18 + local_2c,_fragNdx,1,local_58);
        tcu::Vector<float,_4>::swizzle(&local_88,(int)local_98,1,0,2);
        tcu::operator+((tcu *)&local_68,&local_78,&local_88);
        rr::writeFragmentOutput<tcu::Vector<float,4>>(pFVar3,iVar2,iVar1,0,&local_68);
      }
    }
  }
  return;
}

Assistant:

void VertexVaryingShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
	{
		switch (m_geometryOut)
		{
			case 0:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
				break;

			case 1:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx));
				break;

			case 2:
				for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
					rr::writeFragmentOutput(context, packetNdx, fragNdx, 0,   rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx)
					                                                        + rr::readTriangleVarying<float>(packets[packetNdx], context, 1, fragNdx).swizzle(1, 0, 2, 3));
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}
	}
}